

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::SkipMessageSetField
               (CodedInputStream *input,uint32_t field_number,UnknownFieldSet *unknown_fields)

{
  CodedInputStream *this;
  bool bVar1;
  string *buffer;
  uint32_t local_2c;
  UnknownFieldSet *pUStack_28;
  uint32_t length;
  UnknownFieldSet *unknown_fields_local;
  CodedInputStream *pCStack_18;
  uint32_t field_number_local;
  CodedInputStream *input_local;
  
  pUStack_28 = unknown_fields;
  unknown_fields_local._4_4_ = field_number;
  pCStack_18 = input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_2c);
  this = pCStack_18;
  if (bVar1) {
    buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUStack_28,unknown_fields_local._4_4_);
    input_local._7_1_ = io::CodedInputStream::ReadString(this,buffer,local_2c);
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

bool WireFormat::SkipMessageSetField(io::CodedInputStream* input,
                                     uint32_t field_number,
                                     UnknownFieldSet* unknown_fields) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  return input->ReadString(unknown_fields->AddLengthDelimited(field_number),
                           length);
}